

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mixed_negation.c
# Opt level: O0

int run_container_negation_range
              (run_container_t *src,int range_start,int range_end,container_t **dst)

{
  bool bVar1;
  run_container_t *prVar2;
  container_t *pcVar3;
  undefined8 *in_RCX;
  int in_EDX;
  int in_ESI;
  int *in_RDI;
  int k;
  run_container_t *ans;
  uint8_t *in_stack_00000010;
  uint8_t return_typecode;
  undefined4 in_stack_ffffffffffffffc8;
  int32_t in_stack_ffffffffffffffcc;
  int iVar4;
  byte local_21;
  uint local_4;
  
  if (in_ESI < in_EDX) {
    prVar2 = run_container_create_given_capacity(in_stack_ffffffffffffffcc);
    iVar4 = 0;
    while( true ) {
      bVar1 = false;
      if (iVar4 < *in_RDI) {
        bVar1 = (int)(uint)*(ushort *)(*(long *)(in_RDI + 2) + (long)iVar4 * 4) < in_ESI;
      }
      if (!bVar1) break;
      prVar2->runs[iVar4] = *(rle16_t *)(*(long *)(in_RDI + 2) + (long)iVar4 * 4);
      prVar2->n_runs = prVar2->n_runs + 1;
      iVar4 = iVar4 + 1;
    }
    run_container_smart_append_exclusive
              (prVar2,(uint16_t)in_ESI,((short)in_EDX - (uint16_t)in_ESI) - 1);
    for (; iVar4 < *in_RDI; iVar4 = iVar4 + 1) {
      run_container_smart_append_exclusive
                (prVar2,*(uint16_t *)(*(long *)(in_RDI + 2) + (long)iVar4 * 4),
                 *(uint16_t *)(*(long *)(in_RDI + 2) + 2 + (long)iVar4 * 4));
    }
    pcVar3 = convert_run_to_efficient_container((run_container_t *)dst,in_stack_00000010);
    *in_RCX = pcVar3;
    if (local_21 != 3) {
      run_container_free((run_container_t *)0x1559ff);
    }
    local_4 = (uint)local_21;
  }
  else {
    prVar2 = run_container_clone((run_container_t *)
                                 CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
    *in_RCX = prVar2;
    local_4 = 3;
  }
  return local_4;
}

Assistant:

int run_container_negation_range(const run_container_t *src,
                                 const int range_start, const int range_end,
                                 container_t **dst) {
    uint8_t return_typecode;

    // follows the Java implementation
    if (range_end <= range_start) {
        *dst = run_container_clone(src);
        return RUN_CONTAINER_TYPE;
    }

    run_container_t *ans = run_container_create_given_capacity(
        src->n_runs + 1);  // src->n_runs + 1);
    int k = 0;
    for (; k < src->n_runs && src->runs[k].value < range_start; ++k) {
        ans->runs[k] = src->runs[k];
        ans->n_runs++;
    }

    run_container_smart_append_exclusive(
        ans, (uint16_t)range_start, (uint16_t)(range_end - range_start - 1));

    for (; k < src->n_runs; ++k) {
        run_container_smart_append_exclusive(ans, src->runs[k].value,
                                             src->runs[k].length);
    }

    *dst = convert_run_to_efficient_container(ans, &return_typecode);
    if (return_typecode != RUN_CONTAINER_TYPE) run_container_free(ans);

    return return_typecode;
}